

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_const_char_*,_const_char_*,_int>
* __thiscall
fmt::v8::
make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const*,char_const*,int>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_const_char_*,_const_char_*,_int>
           *__return_storage_ptr__,v8 *this,char **args,char **args_1,int *args_2)

{
  char *pcVar1;
  int *arg_2;
  char_type **arg_1;
  char_type **arg;
  longlong local_128;
  size_t local_120;
  size_t local_d0;
  size_t local_a0;
  int *args_local_2;
  char **args_local_1;
  char **args_local;
  
  pcVar1 = *args;
  local_128._0_4_ = *(undefined4 *)args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_a0;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = pcVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_d0;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_128;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_120;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(const Args&... args)
    -> format_arg_store<Context, Args...> {
  return {args...};
}